

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void lyxp_set_scnode_merge(lyxp_set *set1,lyxp_set *set2)

{
  uint uVar1;
  lyxp_set_node *plVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  uint local_24;
  uint local_20;
  uint32_t j;
  uint32_t i;
  uint32_t orig_used;
  lyxp_set *set2_local;
  lyxp_set *set1_local;
  
  if ((set1->type == LYXP_SET_SCNODE_SET) && (set2->type == LYXP_SET_SCNODE_SET)) {
    if (set2->used != 0) {
      if (set1->used == 0) {
        lyxp_set_free_content(set1);
        memcpy(set1,set2,0x90);
      }
      else {
        if (set1->size < set1->used + set2->used) {
          set1->size = set1->used + set2->used;
          plVar2 = (lyxp_set_node *)ly_realloc((set1->val).nodes,(ulong)set1->size * 0x18);
          (set1->val).nodes = plVar2;
          if ((set1->val).nodes == (lyxp_set_node *)0x0) {
            ly_log(set1->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "lyxp_set_scnode_merge");
            return;
          }
        }
        uVar1 = set1->used;
        for (local_20 = 0; local_20 < set2->used; local_20 = local_20 + 1) {
          local_24 = 0;
          while ((local_24 < uVar1 &&
                 (*(long *)((long)(set1->val).nodes + (ulong)local_24 * 0x18) !=
                  *(long *)((long)(set2->val).nodes + (ulong)local_20 * 0x18)))) {
            local_24 = local_24 + 1;
          }
          if (local_24 < uVar1) {
            if (*(int *)((long)(set1->val).nodes + (ulong)local_24 * 0x18 + 0xc) == -1) {
              *(undefined4 *)((long)(set1->val).nodes + (ulong)local_24 * 0x18 + 0xc) =
                   *(undefined4 *)((long)(set2->val).nodes + (ulong)local_20 * 0x18 + 0xc);
            }
            else if ((*(int *)((long)(set1->val).nodes + (ulong)local_24 * 0x18 + 0xc) == 0) &&
                    (*(int *)((long)(set2->val).nodes + (ulong)local_20 * 0x18 + 0xc) == 1)) {
              *(undefined4 *)((long)(set1->val).nodes + (ulong)local_24 * 0x18 + 0xc) =
                   *(undefined4 *)((long)(set2->val).nodes + (ulong)local_20 * 0x18 + 0xc);
            }
          }
          else {
            puVar3 = (undefined8 *)((long)(set1->val).nodes + (ulong)set1->used * 0x18);
            puVar4 = (undefined8 *)((long)(set2->val).nodes + (ulong)local_20 * 0x18);
            *puVar3 = *puVar4;
            puVar3[1] = puVar4[1];
            puVar3[2] = puVar4[2];
            set1->used = set1->used + 1;
          }
        }
        lyxp_set_free_content(set2);
        set2->type = LYXP_SET_SCNODE_SET;
      }
    }
    return;
  }
  __assert_fail("(set1->type == LYXP_SET_SCNODE_SET) && (set2->type == LYXP_SET_SCNODE_SET)",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                0x4ed,"void lyxp_set_scnode_merge(struct lyxp_set *, struct lyxp_set *)");
}

Assistant:

void
lyxp_set_scnode_merge(struct lyxp_set *set1, struct lyxp_set *set2)
{
    uint32_t orig_used, i, j;

    assert((set1->type == LYXP_SET_SCNODE_SET) && (set2->type == LYXP_SET_SCNODE_SET));

    if (!set2->used) {
        return;
    }

    if (!set1->used) {
        /* release hidden allocated data (lyxp_set.size) */
        lyxp_set_free_content(set1);
        /* direct copying of the entire structure */
        memcpy(set1, set2, sizeof *set1);
        return;
    }

    if (set1->used + set2->used > set1->size) {
        set1->size = set1->used + set2->used;
        set1->val.scnodes = ly_realloc(set1->val.scnodes, set1->size * sizeof *set1->val.scnodes);
        LY_CHECK_ERR_RET(!set1->val.scnodes, LOGMEM(set1->ctx), );
    }

    orig_used = set1->used;

    for (i = 0; i < set2->used; ++i) {
        for (j = 0; j < orig_used; ++j) {
            /* detect duplicities */
            if (set1->val.scnodes[j].scnode == set2->val.scnodes[i].scnode) {
                break;
            }
        }

        if (j < orig_used) {
            /* node is there, but update its status if needed */
            if (set1->val.scnodes[j].in_ctx == LYXP_SET_SCNODE_START_USED) {
                set1->val.scnodes[j].in_ctx = set2->val.scnodes[i].in_ctx;
            } else if ((set1->val.scnodes[j].in_ctx == LYXP_SET_SCNODE_ATOM_NODE) &&
                    (set2->val.scnodes[i].in_ctx == LYXP_SET_SCNODE_ATOM_VAL)) {
                set1->val.scnodes[j].in_ctx = set2->val.scnodes[i].in_ctx;
            }
        } else {
            memcpy(&set1->val.scnodes[set1->used], &set2->val.scnodes[i], sizeof *set2->val.scnodes);
            ++set1->used;
        }
    }

    lyxp_set_free_content(set2);
    set2->type = LYXP_SET_SCNODE_SET;
}